

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_quit(connectdata *conn)

{
  CURLcode CVar1;
  CURLcode result;
  connectdata *conn_local;
  
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
  if (CVar1 == CURLE_OK) {
    state(conn,SMTP_QUIT);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_quit(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Send the QUIT command */
  result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", "QUIT");

  if(!result)
    state(conn, SMTP_QUIT);

  return result;
}